

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O1

tuple<unsigned_long,_unsigned_long,_int> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
::get_coboundary_size_and_gap_and_pivot
          (tuple<unsigned_long,_unsigned_long,_int> *__return_storage_ptr__,
          greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
          *this,filtration_entry_t a)

{
  pointer puVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  unsigned_long uVar8;
  int iVar9;
  unsigned_long uVar10;
  filtration_entry_t fVar11;
  coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  local_58;
  
  local_58.complex = this->complex;
  if (((int)(uint)(local_58.complex)->max_dimension < (local_58.complex)->current_dimension) ||
     ((local_58.complex)->_is_top_dimension != false)) {
    local_58.matrix =
         ((local_58.complex)->coboundary_matrix).
         super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58.coefficient = 1;
    local_58.index = -1;
  }
  else {
    puVar1 = ((local_58.complex)->coboundary_matrix_offsets).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = -1;
    do {
      lVar6 = (local_58.complex)->nb_threads - 1;
      if ((1 - (local_58.complex)->nb_threads) + lVar7 == -1) break;
      lVar6 = lVar7 + 1;
      lVar2 = lVar7 + 2;
      lVar7 = lVar6;
    } while ((int)puVar1[lVar2] <= a.super_pair<float,_entry_t>.second.index);
    local_58.matrix =
         ((local_58.complex)->coboundary_matrix).
         super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
         ._M_impl.super__Vector_impl_data._M_start + lVar6;
    local_58.index = a.super_pair<float,_entry_t>.second.index - (int)puVar1[lVar6];
    local_58.coefficient = a.super_pair<float,_entry_t>.second.coefficient;
  }
  local_58.modulus = (local_58.complex)->modulus;
  local_58.dimension = (short)(local_58.complex)->current_dimension;
  local_58.current_offset = 0;
  bVar3 = directed_flag_complex_in_memory_computer::
          coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
          ::has_next(&local_58);
  if (bVar3) {
    uVar10 = 0;
    uVar8 = 0;
    iVar5 = 0;
    do {
      uVar10 = uVar10 + 1;
      fVar11 = directed_flag_complex_in_memory_computer::
               coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               ::next(&local_58);
      iVar4 = fVar11.super_pair<float,_entry_t>.second.index;
      iVar9 = iVar4;
      if (iVar5 - iVar4 != 0 && iVar4 <= iVar5) {
        iVar9 = iVar5;
      }
      if (iVar5 < iVar4) {
        uVar8 = (long)-(iVar5 - iVar4);
      }
      bVar3 = directed_flag_complex_in_memory_computer::
              coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
              ::has_next(&local_58);
      iVar5 = iVar9;
    } while (bVar3);
  }
  else {
    iVar9 = 0;
    uVar8 = 0;
    uVar10 = 0;
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl = iVar9;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = uVar8;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar10;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(filtration_entry_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		auto iterator = complex.coboundary(a);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}